

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyseCode.cpp
# Opt level: O1

uint immed_to_unsgned(string *is16,string *str)

{
  uint uVar1;
  int iVar2;
  int data_num;
  stringstream ss;
  uint local_19c;
  stringstream local_198 [16];
  long local_188 [3];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  iVar2 = std::__cxx11::string::compare((char *)is16);
  if (iVar2 == 0) {
    local_19c = 0xffffffff;
    std::__cxx11::stringstream::stringstream(local_198);
    *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) =
         *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) & 0xffffffb5 | 8;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,(str->_M_dataplus)._M_p,str->_M_string_length);
    std::istream::operator>>((istream *)local_198,(int *)&local_19c);
  }
  else {
    std::__cxx11::string::compare((char *)is16);
    local_19c = 0xffffffff;
    std::__cxx11::stringstream::stringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,(str->_M_dataplus)._M_p,str->_M_string_length);
    std::istream::operator>>((istream *)local_198,(int *)&local_19c);
  }
  uVar1 = local_19c;
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return uVar1;
}

Assistant:

unsigned immed_to_unsgned(std::string is16, std::string str){
	if (is16 == "0X") {//为16进制数
		int data_num{ -1 };
		std::stringstream ss;
		ss << std::hex << str;
		ss >> data_num;
		return (unsigned)data_num;
	}
	else if (is16 == "") {//10进制数
		int data_num{ -1 };
		std::stringstream ss;
		ss << str;
		ss >> data_num;
		return (unsigned)data_num;
	}
}